

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateWhile(ExpressionEvalContext *ctx,ExprWhile *expression)

{
  StackFrame *expression_00;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  long local_38;
  longlong result;
  ExprBase *condition;
  StackFrame *frame;
  ExprWhile *expression_local;
  ExpressionEvalContext *ctx_local;
  
  frame = (StackFrame *)expression;
  expression_local = (ExprWhile *)ctx;
  ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  condition = (ExprBase *)*ppSVar2;
  while( true ) {
    bVar1 = AddInstruction((ExpressionEvalContext *)expression_local);
    if (!bVar1) {
      return (ExprBase *)0x0;
    }
    if (*(int *)&condition[0xb].type == 0) {
      result = (longlong)
               Evaluate((ExpressionEvalContext *)expression_local,
                        &((frame->variables).little[1].ptr)->super_ExprBase);
      if ((ExprBase *)result == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      bVar1 = TryTakeLong((ExprBase *)result,&local_38);
      if (!bVar1) {
        pEVar3 = Report((ExpressionEvalContext *)expression_local,
                        "ERROR: failed to evaluate \'while\' condition");
        return pEVar3;
      }
      if (local_38 == 0) goto LAB_0019170a;
    }
    pEVar3 = Evaluate((ExpressionEvalContext *)expression_local,
                      (ExprBase *)(frame->variables).little[2].variable);
    if (pEVar3 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if (*(int *)((long)&condition[0xb].type + 4) != 0) break;
    if (((*(int *)&condition[0xb].next != 0) &&
        (*(int *)&condition[0xb].next = *(int *)&condition[0xb].next + -1,
        *(int *)&condition[0xb].next != 0)) || (condition[0xb].source != (SynBase *)0x0))
    goto LAB_0019170a;
  }
  *(int *)((long)&condition[0xb].type + 4) = *(int *)((long)&condition[0xb].type + 4) + -1;
LAB_0019170a:
  expression_00 = frame;
  pEVar3 = &ExpressionContext::get<ExprVoid>
                      ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
            super_ExprBase;
  ExprVoid::ExprVoid((ExprVoid *)pEVar3,*(SynBase **)&(frame->variables).count,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
  pEVar3 = CheckType((ExprBase *)expression_00,pEVar3);
  return pEVar3;
}

Assistant:

ExprBase* EvaluateWhile(ExpressionEvalContext &ctx, ExprWhile *expression)
{
	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(;;)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!frame->targetYield)
		{
			ExprBase *condition = Evaluate(ctx, expression->condition);

			if(!condition)
				return NULL;

			long long result;
			if(!TryTakeLong(condition, result))
				return Report(ctx, "ERROR: failed to evaluate 'while' condition");

			if(!result)
				break;
		}

		if(!Evaluate(ctx, expression->body))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;
			break;
		}

		// On continue, decrease depth and proceed to next iteration, unless it's a multi-level continue
		if(frame->continueDepth)
		{
			frame->continueDepth--;

			if(frame->continueDepth)
				break;
		}

		if(frame->returnValue)
			break;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}